

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_strategy.c
# Opt level: O3

void av1_configure_buffer_updates
               (AV1_COMP *cpi,RefreshFrameInfo *refresh_frame,FRAME_UPDATE_TYPE type,
               REFBUF_STATE refbuf_state,int force_refresh_all)

{
  _Bool _Var1;
  _Bool _Var2;
  AV1_PRIMARY *pAVar3;
  byte bVar4;
  undefined7 in_register_00000011;
  
  (cpi->rc).is_src_frame_alt_ref = 0;
  switch(CONCAT71(in_register_00000011,type) & 0xffffffff) {
  case 0:
switchD_00b9cae3_caseD_0:
    refresh_frame->golden_frame = true;
    refresh_frame->bwd_ref_frame = true;
    goto LAB_00b9cb12;
  case 1:
    refresh_frame->golden_frame = false;
    refresh_frame->bwd_ref_frame = false;
    break;
  case 2:
    refresh_frame->golden_frame = true;
    refresh_frame->bwd_ref_frame = false;
    break;
  case 3:
    if (refbuf_state == '\0') goto switchD_00b9cae3_caseD_0;
    refresh_frame->golden_frame = false;
    refresh_frame->bwd_ref_frame = false;
LAB_00b9cb12:
    refresh_frame->alt_ref_frame = true;
    goto switchD_00b9cae3_default;
  case 4:
    refresh_frame->golden_frame = true;
    refresh_frame->bwd_ref_frame = refbuf_state == '\0';
    refresh_frame->alt_ref_frame = refbuf_state == '\0';
    goto LAB_00b9cb21;
  case 5:
    refresh_frame->golden_frame = false;
    refresh_frame->bwd_ref_frame = false;
    refresh_frame->alt_ref_frame = false;
LAB_00b9cb21:
    (cpi->rc).is_src_frame_alt_ref = 1;
    goto switchD_00b9cae3_default;
  case 6:
    refresh_frame->golden_frame = false;
    refresh_frame->bwd_ref_frame = true;
    break;
  default:
    goto switchD_00b9cae3_default;
  }
  refresh_frame->alt_ref_frame = false;
switchD_00b9cae3_default:
  if ((((cpi->ext_flags).refresh_frame.update_pending == true) &&
      ((cpi->oxcf).pass != AOM_RC_FIRST_PASS)) && (cpi->compressor_stage != '\x01')) {
    _Var1 = (cpi->ext_flags).refresh_frame.golden_frame;
    _Var2 = (cpi->ext_flags).refresh_frame.bwd_ref_frame;
    bVar4 = (cpi->ext_flags).refresh_frame.alt_ref_frame;
    refresh_frame->golden_frame = _Var1;
    refresh_frame->bwd_ref_frame = _Var2;
    refresh_frame->alt_ref_frame = (_Bool)bVar4;
    pAVar3 = cpi->ppi;
    if (_Var1 == true) {
      (pAVar3->gf_group).update_type[cpi->gf_frame_index] = '\x02';
      bVar4 = (cpi->ext_flags).refresh_frame.alt_ref_frame;
    }
    if ((bVar4 & 1) != 0) {
      (pAVar3->gf_group).update_type[cpi->gf_frame_index] = '\x03';
    }
    if ((cpi->ext_flags).refresh_frame.bwd_ref_frame == true) {
      (pAVar3->gf_group).update_type[cpi->gf_frame_index] = '\x06';
    }
  }
  if (force_refresh_all != 0) {
    refresh_frame->golden_frame = true;
    refresh_frame->bwd_ref_frame = true;
    refresh_frame->alt_ref_frame = true;
  }
  return;
}

Assistant:

void av1_configure_buffer_updates(AV1_COMP *const cpi,
                                  RefreshFrameInfo *const refresh_frame,
                                  const FRAME_UPDATE_TYPE type,
                                  const REFBUF_STATE refbuf_state,
                                  int force_refresh_all) {
  // NOTE(weitinglin): Should we define another function to take care of
  // cpi->rc.is_$Source_Type to make this function as it is in the comment?
  const ExtRefreshFrameFlagsInfo *const ext_refresh_frame_flags =
      &cpi->ext_flags.refresh_frame;
  cpi->rc.is_src_frame_alt_ref = 0;

  switch (type) {
    case KF_UPDATE:
      set_refresh_frame_flags(refresh_frame, true, true, true);
      break;

    case LF_UPDATE:
      set_refresh_frame_flags(refresh_frame, false, false, false);
      break;

    case GF_UPDATE:
      set_refresh_frame_flags(refresh_frame, true, false, false);
      break;

    case OVERLAY_UPDATE:
      if (refbuf_state == REFBUF_RESET)
        set_refresh_frame_flags(refresh_frame, true, true, true);
      else
        set_refresh_frame_flags(refresh_frame, true, false, false);

      cpi->rc.is_src_frame_alt_ref = 1;
      break;

    case ARF_UPDATE:
      // NOTE: BWDREF does not get updated along with ALTREF_FRAME.
      if (refbuf_state == REFBUF_RESET)
        set_refresh_frame_flags(refresh_frame, true, true, true);
      else
        set_refresh_frame_flags(refresh_frame, false, false, true);

      break;

    case INTNL_OVERLAY_UPDATE:
      set_refresh_frame_flags(refresh_frame, false, false, false);
      cpi->rc.is_src_frame_alt_ref = 1;
      break;

    case INTNL_ARF_UPDATE:
      set_refresh_frame_flags(refresh_frame, false, true, false);
      break;

    default: assert(0); break;
  }

  if (ext_refresh_frame_flags->update_pending &&
      (!is_stat_generation_stage(cpi))) {
    set_refresh_frame_flags(refresh_frame,
                            ext_refresh_frame_flags->golden_frame,
                            ext_refresh_frame_flags->bwd_ref_frame,
                            ext_refresh_frame_flags->alt_ref_frame);
    GF_GROUP *gf_group = &cpi->ppi->gf_group;
    if (ext_refresh_frame_flags->golden_frame)
      gf_group->update_type[cpi->gf_frame_index] = GF_UPDATE;
    if (ext_refresh_frame_flags->alt_ref_frame)
      gf_group->update_type[cpi->gf_frame_index] = ARF_UPDATE;
    if (ext_refresh_frame_flags->bwd_ref_frame)
      gf_group->update_type[cpi->gf_frame_index] = INTNL_ARF_UPDATE;
  }

  if (force_refresh_all)
    set_refresh_frame_flags(refresh_frame, true, true, true);
}